

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O3

ChannelList *
anon_unknown.dwarf_285e7e::setupBuffer
          (ChannelList *__return_storage_ptr__,Header *hdr,char **channels,char **passivechannels,
          PixelType *pt,FrameBuffer *buf,FrameBuffer *prereadbuf,FrameBuffer *postreadbuf,int banks,
          bool writing)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Channel *pCVar6;
  Slice *pSVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int *piVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ChannelList *pCVar15;
  bool bVar16;
  long *plVar17;
  ulong uVar18;
  uint uVar19;
  PixelType PVar20;
  vector<char,_std::allocator<char>_> *this;
  pointer pcVar21;
  pointer pcVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  char *pcVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  Channel local_68 [56];
  
  piVar11 = (int *)Imf_3_2::Header::dataWindow();
  iVar2 = *piVar11;
  iVar3 = piVar11[1];
  iVar24 = piVar11[2];
  lVar12 = 0;
  if (*channels == (char *)0x0) {
    bVar16 = false;
    iVar9 = 0;
    uVar18 = 0;
  }
  else {
    iVar9 = 0;
    bVar16 = false;
    uVar13 = 0;
    do {
      if (pt == (PixelType *)0x0) {
LAB_001951b5:
        iVar9 = iVar9 + 2;
      }
      else {
        PVar20 = pt[uVar13];
        if ((PVar20 != UINT) && (PVar20 != FLOAT)) {
          if (PVar20 == HALF) goto LAB_001951b5;
          goto LAB_00195623;
        }
        iVar9 = iVar9 + (-iVar9 & 3U) + 4;
        bVar16 = true;
      }
      uVar18 = uVar13 + 1;
      lVar23 = uVar13 + 1;
      uVar13 = uVar18;
    } while (channels[lVar23] != (char *)0x0);
  }
  iVar25 = (int)uVar18;
  uVar18 = uVar18 & 0xffffffff;
  if ((passivechannels != (char **)0x0) && (*passivechannels != (char *)0x0)) {
    lVar23 = 0;
LAB_00195214:
    if (pt == (PixelType *)0x0) {
LAB_00195231:
      iVar9 = iVar9 + 2;
    }
    else {
      PVar20 = pt[uVar18 + lVar23];
      if ((PVar20 != UINT) && (PVar20 != FLOAT)) {
        if (PVar20 == HALF) goto LAB_00195231;
LAB_00195623:
        std::operator<<((ostream *)&std::cout,"Unexpected PixelType?\n");
LAB_00195636:
        exit(1);
      }
      iVar9 = iVar9 + (-iVar9 & 3U) + 4;
      bVar16 = true;
    }
    lVar12 = lVar23 + 1;
    lVar8 = lVar23 + 1;
    lVar23 = lVar12;
    if (passivechannels[lVar8] == (char *)0x0) goto LAB_00195250;
    goto LAB_00195214;
  }
LAB_00195250:
  uVar19 = -iVar9 & 3;
  if (!bVar16) {
    uVar19 = 0;
  }
  iVar9 = uVar19 + iVar9;
  uVar19 = (int)lVar12 + iVar25;
  lVar12 = Imf_3_2::Header::dataWindow();
  iVar27 = *(int *)(lVar12 + 8);
  piVar11 = (int *)Imf_3_2::Header::dataWindow();
  iVar4 = *piVar11;
  lVar12 = Imf_3_2::Header::dataWindow();
  iVar5 = *(int *)(lVar12 + 0xc);
  lVar12 = Imf_3_2::Header::dataWindow();
  iVar27 = ((iVar27 - iVar4) + 1) * uVar19 * ((iVar5 - *(int *)(lVar12 + 4)) + 1);
  this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::readingBuffer;
  if (writing) {
    this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::writingBuffer;
  }
  std::vector<char,_std::allocator<char>_>::resize(this,(long)(iVar27 * iVar9));
  if (0 < iVar27) {
    pcVar21 = (this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar29 = 0;
    do {
      uVar10 = random_int(0xffff);
      if ((pt == (PixelType *)0x0) || (pt[(int)uVar29] == HALF)) {
        *(short *)pcVar21 = (short)uVar10;
        pcVar21 = pcVar21 + 2;
      }
      else {
        pcVar22 = pcVar21 + (-(int)pcVar21 & 3);
        pcVar21 = pcVar22 + 4;
        *(undefined4 *)pcVar22 =
             *(undefined4 *)(_imath_half_to_float_table + (ulong)(uVar10 & 0xffff) * 4);
      }
      uVar29 = uVar29 + 1;
      if (uVar29 == uVar19) {
        uVar29 = 0;
      }
      iVar27 = iVar27 + -1;
    } while (iVar27 != 0);
  }
  if (!writing) {
    std::vector<char,_std::allocator<char>_>::operator=
              ((vector<char,_std::allocator<char>_> *)(anonymous_namespace)::preReadBuffer,
               (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::readingBuffer);
  }
  p_Var1 = &(__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar24 = iVar9 * ((iVar24 - iVar2) + 1);
  pCVar15 = (ChannelList *)((long)iVar24 / (long)banks & 0xffffffff);
  if (uVar19 != 0) {
    uVar13 = (ulong)(iVar9 / banks);
    uVar14 = (ulong)iVar24;
    uVar28 = 0;
    pcVar26 = (char *)0x0;
    do {
      PVar20 = HALF;
      if (pt != (PixelType *)0x0) {
        PVar20 = pt[uVar28];
      }
      if (uVar28 < uVar18 && writing) {
        pCVar6 = (Channel *)channels[uVar28];
        Imf_3_2::Channel::Channel(local_68,PVar20,1,1,false);
        Imf_3_2::ChannelList::insert((char *)__return_storage_ptr__,pCVar6);
      }
      uVar30 = (ulong)(uint)((int)uVar28 >> 0x1f) << 0x20 | uVar28 & 0xffffffff;
      if ((int)((long)uVar30 % (long)((int)uVar19 / banks)) == 0) {
        plVar17 = &(anonymous_namespace)::readingBuffer;
        if (writing) {
          plVar17 = &(anonymous_namespace)::writingBuffer;
        }
        pcVar26 = (char *)(((long)((int)((long)uVar30 / (long)((int)uVar19 / banks)) *
                                  (int)((long)iVar24 / (long)banks)) + *plVar17) -
                          (long)(iVar3 * iVar24 + iVar2 * (iVar9 / banks)));
      }
      uVar30 = (ulong)(-(int)pcVar26 & 3);
      if ((PVar20 & ~FLOAT) != UINT) {
        uVar30 = 0;
      }
      pcVar26 = pcVar26 + uVar30;
      if (uVar28 < uVar18) {
        pSVar7 = (Slice *)channels[uVar28];
        Imf_3_2::Slice::Slice
                  ((Slice *)local_68,PVar20,pcVar26,uVar13,uVar14,1,1,(double)((int)uVar28 + 100),
                   false,false);
        Imf_3_2::FrameBuffer::insert((char *)buf,pSVar7);
      }
      else if (!writing) {
        pSVar7 = (Slice *)passivechannels[uVar28 - (long)iVar25];
        Imf_3_2::Slice::Slice((Slice *)local_68,PVar20,pcVar26,uVar13,uVar14,1,1,0.4,false,false);
        Imf_3_2::FrameBuffer::insert((char *)postreadbuf,pSVar7);
        pSVar7 = (Slice *)passivechannels[uVar28 - (long)iVar25];
        Imf_3_2::Slice::Slice
                  ((Slice *)local_68,PVar20,
                   pcVar26 + ((anonymous_namespace)::preReadBuffer._0_8_ -
                             (anonymous_namespace)::readingBuffer),uVar13,uVar14,1,1,0.4,false,false
                  );
        Imf_3_2::FrameBuffer::insert((char *)prereadbuf,pSVar7);
      }
      pCVar15 = (ChannelList *)0x2;
      if (PVar20 != HALF) {
        if (PVar20 != FLOAT) {
          std::operator<<((ostream *)&std::cout,"Unexpected Pixel Type\n");
          goto LAB_00195636;
        }
        pCVar15 = (ChannelList *)0x4;
      }
      pcVar26 = pcVar26 + (long)pCVar15;
      uVar28 = uVar28 + 1;
    } while (uVar19 != uVar28);
  }
  return pCVar15;
}

Assistant:

ChannelList
setupBuffer (
    const Header&      hdr,      // header to grab datawindow from
    const char* const* channels, // NULL terminated list of channels to write
    const char* const*
        passivechannels,  // NULL terminated list of channels to write
    const PixelType* pt,  // type of each channel, or NULL for all HALF
    FrameBuffer&     buf, // buffer to fill with pointers to channel
    FrameBuffer&
        prereadbuf, // channels which aren't being read - indexes into the preread buffer
    FrameBuffer&
         postreadbuf, // channels which aren't being read - indexes into the postread buffer
    int  banks, // number of banks - channels within each bank are interleaved, banks are scanline interleaved
    bool writing // true if should allocate
)
{
    Box2i dw = hdr.dataWindow ();

    //
    // how many channels in total
    //
    int  activechans     = 0;
    int  bytes_per_pixel = 0;
    bool has32BitValue   = false;
    while (channels[activechans] != NULL)
    {
        if (pt == NULL) { bytes_per_pixel += 2; }
        else
        {
            switch (pt[activechans])
            {
                case IMF::HALF: bytes_per_pixel += 2; break;
                case IMF::FLOAT:
                case IMF::UINT:
                    // some architectures (e.g arm7 cannot write 32 bit values
                    // to addresses which aren't aligned to 32 bit addresses)
                    // so bump to next multiple of four
                    bytes_per_pixel = alignToFour (bytes_per_pixel);
                    bytes_per_pixel += 4;
                    has32BitValue = true;
                    break;

                default: cout << "Unexpected PixelType?\n"; exit (1);
            }
        }
        activechans++;
    }

    int passivechans = 0;
    while (passivechannels != NULL && passivechannels[passivechans] != NULL)
    {
        if (pt == NULL) { bytes_per_pixel += 2; }
        else
        {
            switch (pt[passivechans + activechans])
            {
                case IMF::HALF: bytes_per_pixel += 2; break;
                case IMF::FLOAT:
                case IMF::UINT:
                    bytes_per_pixel = alignToFour (bytes_per_pixel);
                    bytes_per_pixel += 4;
                    has32BitValue = true;
                    break;
                default: cout << "Unexpected PixelType?\n"; exit (1);
            }
        }
        passivechans++;
    }

    if (has32BitValue) { bytes_per_pixel = alignToFour (bytes_per_pixel); }

    int chans = activechans + passivechans;

    int bytes_per_bank = bytes_per_pixel / banks;

    int samples = (hdr.dataWindow ().max.x + 1 - hdr.dataWindow ().min.x) *
                  (hdr.dataWindow ().max.y + 1 - hdr.dataWindow ().min.y) *
                  chans;

    int size = samples * bytes_per_pixel;

    if (writing) { writingBuffer.resize (size); }
    else
    {
        readingBuffer.resize (size);
    }

    const char* write_ptr = writing ? &writingBuffer[0] : &readingBuffer[0];
    // fill with random halfs, casting to floats for float channels
    int chan = 0;
    for (int i = 0; i < samples; i++)
    {
        unsigned short int values =
            random_int (std::numeric_limits<unsigned short>::max ());
        half v;
        v.setBits (values);
        if (pt == NULL || pt[chan] == IMF::HALF)
        {
            *(half*) write_ptr = half (v);
            write_ptr += 2;
        }
        else
        {
            write_ptr           = alignToFour (write_ptr);
            *(float*) write_ptr = float (v);

            write_ptr += 4;
        }
        chan++;
        if (chan == chans) { chan = 0; }
    }

    if (!writing)
    {
        //take a copy of the buffer as it was before being read
        preReadBuffer = readingBuffer;
    }

    char* offset = NULL;

    ChannelList chanlist;

    int bytes_per_row      = bytes_per_pixel * (dw.max.x + 1 - dw.min.x);
    int bytes_per_bank_row = bytes_per_row / banks;

    int first_pixel_index =
        bytes_per_row * dw.min.y + bytes_per_bank * dw.min.x;

    for (int i = 0; i < chans; i++)
    {
        PixelType type = pt == NULL ? IMF::HALF : pt[i];
        if (i < activechans && writing) { chanlist.insert (channels[i], type); }

        if (i % (chans / banks) == 0)
        {
            //
            // set offset pointer to beginning of bank
            //

            int bank = i / (chans / banks);
            offset   = (writing ? &writingBuffer[0] : &readingBuffer[0]) +
                     bank * bytes_per_bank_row - first_pixel_index;
        }

        if (type == FLOAT || type == UINT) { offset = alignToFour (offset); }

        if (i < activechans)
        {

            buf.insert (
                channels[i],
                Slice (
                    type,
                    offset,
                    bytes_per_bank,
                    bytes_per_row,
                    1,
                    1,
                    100 + i));
        }
        else
        {
            if (!writing)
            {

                postreadbuf.insert (
                    passivechannels[i - activechans],
                    Slice (
                        type,
                        offset,
                        bytes_per_bank,
                        bytes_per_row,
                        1,
                        1,
                        0.4));

                char* pre_offset =
                    offset - &readingBuffer[0] + &preReadBuffer[0];

                prereadbuf.insert (
                    passivechannels[i - activechans],
                    Slice (
                        type,
                        pre_offset,
                        bytes_per_bank,
                        bytes_per_row,
                        1,
                        1,
                        0.4));
            }
        }
        switch (type)
        {
            case IMF::HALF: offset += 2; break;
            case IMF::FLOAT: offset += 4; break;
            default: cout << "Unexpected Pixel Type\n"; exit (1);
        }
    }

    return chanlist;
}